

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::ImageSampleInstanceImages
          (ImageSampleInstanceImages *this,DeviceInterface *vki,VkDevice device,
          deUint32 queueFamilyIndex,VkQueue queue,Allocator *allocator,
          VkDescriptorType descriptorType,ShaderInputInterface shaderInterface,
          VkImageViewType viewType,deUint32 baseMipLevel,deUint32 baseArraySlice,bool immutable)

{
  TextureFormat *format;
  Handle<(vk::HandleType)20> HVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  int numImages;
  Move<vk::Handle<(vk::HandleType)20>_> local_a8;
  VkSamplerCreateInfo createInfo;
  
  if (descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    numImages = 1;
  }
  else {
    numImages = 0;
    if ((descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) &&
       (shaderInterface < SHADER_INPUT_LAST)) {
      numImages = *(int *)(&DAT_00b196d0 + (ulong)shaderInterface * 4);
    }
  }
  ImageInstanceImages::ImageInstanceImages
            (&this->super_ImageInstanceImages,vki,device,queueFamilyIndex,queue,allocator,
             descriptorType,viewType,numImages,baseMipLevel,baseArraySlice);
  this->m_descriptorType = descriptorType;
  this->m_shaderInterface = shaderInterface;
  this->m_isImmutable = immutable;
  (this->m_refSamplerA).wrapS = REPEAT_GL;
  (this->m_refSamplerA).wrapT = REPEAT_GL;
  (this->m_refSamplerA).wrapR = REPEAT_GL;
  (this->m_refSamplerA).minFilter = LINEAR;
  (this->m_refSamplerA).magFilter = LINEAR;
  (this->m_refSamplerA).lodThreshold = 0.0;
  (this->m_refSamplerA).normalizedCoords = true;
  (this->m_refSamplerA).compare = COMPAREMODE_NONE;
  (this->m_refSamplerA).compareChannel = 0;
  *(undefined8 *)&(this->m_refSamplerA).borderColor.v = 0;
  *(undefined8 *)((long)&(this->m_refSamplerA).borderColor.v + 1) = 0;
  *(undefined8 *)((long)&(this->m_refSamplerA).borderColor.v + 9) = 0;
  *(undefined8 *)&(this->m_refSamplerA).depthStencilMode = 0;
  (this->m_refSamplerB).wrapT = CLAMP_TO_EDGE;
  (this->m_refSamplerB).wrapR = CLAMP_TO_EDGE;
  (this->m_refSamplerB).wrapR = CLAMP_TO_EDGE;
  (this->m_refSamplerB).minFilter = NEAREST;
  (this->m_refSamplerB).magFilter = NEAREST;
  (this->m_refSamplerB).lodThreshold = 0.0;
  (this->m_refSamplerB).normalizedCoords = true;
  (this->m_refSamplerB).depthStencilMode = MODE_DEPTH;
  (this->m_refSamplerB).compare = COMPAREMODE_NONE;
  (this->m_refSamplerB).compareChannel = 0;
  *(undefined8 *)&(this->m_refSamplerB).borderColor.v = 0;
  *(undefined8 *)((long)&(this->m_refSamplerB).borderColor.v + 1) = 0;
  *(undefined8 *)((long)&(this->m_refSamplerB).borderColor.v + 9) = 0;
  format = &(this->super_ImageInstanceImages).m_imageFormat;
  ::vk::mapSampler(&createInfo,&this->m_refSamplerA,format,0.0,1000.0);
  ::vk::createSampler(&local_a8,vki,device,&createInfo,(VkAllocationCallbacks *)0x0);
  pVVar4 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator;
  pVVar3 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device;
  pDVar2 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface;
  HVar1.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  createInfo._16_8_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device;
  createInfo._24_8_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator;
  createInfo._0_8_ =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  createInfo.pNext =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = pVVar3
  ;
  (this->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       pVVar4;
  (this->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal =
       HVar1.m_internal;
  (this->m_samplerA).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       pDVar2;
  if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal = 0;
    local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
  }
  else {
    ::vk::mapSampler(&createInfo,&this->m_refSamplerB,format,0.0,1000.0);
    ::vk::createSampler(&local_a8,vki,device,&createInfo,(VkAllocationCallbacks *)0x0);
  }
  (this->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device;
  (this->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator;
  (this->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  (this->m_samplerB).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface;
  return;
}

Assistant:

ImageSampleInstanceImages::ImageSampleInstanceImages (const vk::DeviceInterface&	vki,
													  vk::VkDevice					device,
													  deUint32						queueFamilyIndex,
													  vk::VkQueue					queue,
													  vk::Allocator&				allocator,
													  vk::VkDescriptorType			descriptorType,
													  ShaderInputInterface			shaderInterface,
													  vk::VkImageViewType			viewType,
													  deUint32						baseMipLevel,
													  deUint32						baseArraySlice,
													  bool							immutable)
	: ImageInstanceImages	(vki,
							 device,
							 queueFamilyIndex,
							 queue,
							 allocator,
							 descriptorType,
							 viewType,
							 getNumImages(descriptorType, shaderInterface),
							 baseMipLevel,
							 baseArraySlice)
	, m_descriptorType		(descriptorType)
	, m_shaderInterface		(shaderInterface)
	, m_isImmutable			(immutable)
	, m_refSamplerA			(createRefSampler(true))
	, m_refSamplerB			(createRefSampler(false))
	, m_samplerA			(createSampler(vki, device, m_refSamplerA, m_imageFormat))
	, m_samplerB			((getInterfaceNumResources(m_shaderInterface) == 1u)
								? vk::Move<vk::VkSampler>()
								: createSampler(vki, device, m_refSamplerB, m_imageFormat))
{
}